

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O1

bool __thiscall CumulativeCalProp::propagate(CumulativeCalProp *this)

{
  undefined1 *puVar1;
  uint i;
  int tw_begin;
  int tw_end;
  int *piVar2;
  int *piVar3;
  IntVar *pIVar4;
  int *piVar5;
  IntVar *pIVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  TrailElem local_40;
  
  puVar1 = &(this->super_Propagator).field_0x14;
  iVar10 = *(int *)&(this->super_Propagator).field_0x14;
  uVar12 = (ulong)iVar10;
  if (-1 < (long)uVar12) {
    lVar9 = uVar12 + 1;
    do {
      i = (this->task_id).data[lVar9 + -1];
      if ((0 < ((this->dur).data[i]->min).v) && (0 < ((this->usage).data[i]->min).v)) {
        retrieveCoreParameters(this,i);
      }
      piVar2 = this->est_2;
      piVar3 = this->lct_2;
      pIVar4 = (this->start).data[i];
      if (((((pIVar4->min).v == (pIVar4->max).v) &&
           (pIVar4 = (this->dur).data[i], (pIVar4->min).v == (pIVar4->max).v)) &&
          (pIVar4 = (this->usage).data[i], (pIVar4->min).v == (pIVar4->max).v)) ||
         ((((this->dur).data[i]->max).v < 1 || (((this->usage).data[i]->max).v < 1)))) {
        piVar5 = (this->task_id).data;
        piVar5[lVar9 + -1] = piVar5[uVar12 & 0xffffffff];
        piVar5[uVar12 & 0xffffffff] = i;
        uVar12 = (ulong)((int)uVar12 - 1);
        piVar5 = this->min_energy2;
        if ((piVar5 != (int *)0x0) &&
           ((pIVar4 = (this->dur).data[i], 0 < (pIVar4->min).v &&
            (pIVar6 = (this->usage).data[i], 0 < (pIVar6->min).v)))) {
          this->free_energy2[(int)i] = 0;
          if (this->rho == 1) {
            iVar10 = piVar3[(int)i] - piVar2[(int)i];
          }
          else {
            iVar10 = (pIVar4->min).v;
          }
          piVar5[(int)i] = iVar10 * (pIVar6->min).v;
        }
      }
      iVar10 = (int)uVar12;
      lVar11 = lVar9 + -1;
      bVar7 = 0 < lVar9;
      lVar9 = lVar11;
    } while (lVar11 != 0 && bVar7);
  }
  tw_begin = this->minTime;
  tw_end = this->maxTime;
  local_40.x = *(int *)&(this->super_Propagator).field_0x14;
  local_40.sz = 4;
  local_40.pt = (int *)puVar1;
  vec<TrailElem>::push(&engine.trail,&local_40);
  *(int *)&(this->super_Propagator).field_0x14 = iVar10;
  do {
    this->bound_update = false;
    this->tt_profile_size = 0;
    if (((this->tt_check != false) || (this->tt_filt == true)) &&
       (bVar7 = time_table_propagation(this,&this->task_id,tw_begin,tw_end), !bVar7)) {
      return false;
    }
    if (((this->bound_update == false) && (0 < *(int *)&(this->super_Propagator).field_0x14)) &&
       ((this->ttef_check != false || (this->ttef_filt == true)))) {
      lVar9 = this->nb_prop_calls + 1;
      this->nb_prop_calls = lVar9;
      if ((this->ttef_prop_factor == 0) || (lVar9 % this->ttef_prop_factor == 0)) {
        if (-1 < *(int *)puVar1) {
          lVar9 = -1;
          do {
            iVar10 = (this->task_id).data[lVar9 + 1];
            iVar8 = retrieveMinEnergy(this,iVar10);
            this->min_energy2[iVar10] = iVar8;
            iVar8 = retrieveFreeEnergy(this,iVar10);
            this->free_energy2[iVar10] = iVar8;
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)&(this->super_Propagator).field_0x14);
        }
        ttef_initialise_parameters(this);
        if (this->ttef_filt == false) {
          bVar7 = ttef_consistency_check(this,1);
        }
        else {
          bVar7 = ttef_bounds_propagation(this,1,2);
        }
        if (bVar7 == false) {
          return false;
        }
      }
    }
    if (this->idem != true) {
      return true;
    }
  } while (this->bound_update != false);
  return true;
}

Assistant:

CUMU_BOOL
	propagate() override {
#if CUMUVERB > 1
		fprintf(stderr, "Entering cumulative propagation\n");
#endif
		assert(last_unfixed >= 0);
		// Retrieval of the task's core data and updating
		// the fixed-task array
		int new_unfixed = last_unfixed;
		int tw_begin = maxTime;
		int tw_end = minTime;
		for (int ii = new_unfixed; ii >= 0; ii--) {
			const int i = task_id[ii];
			// Retrieve core data (est, lst, ect, lct)
			if (min_dur(i) > 0 && min_usage(i) > 0) {
				retrieveCoreParameters(i);
			}
			// Compute the time window for consideration
			tw_begin = std::min(tw_begin, est_2[i]);
			tw_end = std::max(tw_end, lct_2[i]);
			// Check whether the task 'i' is fixed
			if ((CUMU_PT_ISFIXED(start[i]) && CUMU_PT_ISFIXED(dur[i]) && CUMU_PT_ISFIXED(usage[i])) ||
					max_dur(i) <= 0 || max_usage(i) <= 0) {
				// Swapping the id's
				task_id[ii] = task_id[new_unfixed];
				task_id[new_unfixed] = i;
				new_unfixed--;
				if (min_energy2 != nullptr && min_dur(i) > 0 && min_usage(i) > 0) {
					free_energy2[i] = 0;
					if (rho == 1) {
						// Resource stays engaged
						min_energy2[i] = min_usage(i) * (lct_2[i] - est_2[i]);
					} else {
						// Resource is released
						min_energy2[i] = min_usage(i) * min_dur(i);
					}
				}
			}
		}
		tw_begin = minTime;
		tw_end = maxTime;
		// Trailing the index of the last unfixed task
		last_unfixed = new_unfixed;
#if CUMUVERB > 1
		fprintf(stderr, "\tEntering cumulative propagation loop\n");
#endif
		// idempotent
		do {
			bound_update = false;
			// Resetting the profile size
			tt_profile_size = 0;
			// Time-table propagators
			if (tt_check || tt_filt) {
				// Time-table propagation
				if (!time_table_propagation(task_id, tw_begin, tw_end)) {
					// Inconsistency was detected
#if CUMUVERB > 1
					fprintf(stderr, "Leaving cumulative propagation with failure\n");
#endif
					return false;
				}
			}
			// if (!bound_update)
			//	nb_prop_calls++;
			//  Time-table-edge-finding propagation
			if (!bound_update && last_unfixed > 0 &&
					(ttef_check || ttef_filt)) {  // && nb_prop_calls % 100 == 0) {
				nb_prop_calls++;
				if (ttef_prop_factor != 0 && nb_prop_calls % ttef_prop_factor != 0) {
					continue;
				}
#if CUMUVERB > 0
				fprintf(stderr, "Entering TTEF\n");
#endif
				// Retrieval of the data required for the TTEF propagation
				for (int ii = 0; ii <= last_unfixed; ii++) {
					const int i = task_id[ii];
					retrieveEnergyParameters(i);
				}
				// Initialisation of necessary structures
				// - Unfixed tasks sorted according earliest start time
				// - Unfixed tasks sorted according latest completion time
				// - Energy of the compulsory parts after the latest completion
				// 	 time of unfixed tasks
				// - Energy of the compulsory parts after the earliest start
				//   time of unfixed tasks
				ttef_initialise_parameters();

				// TTEF filtering algorithm
				if (ttef_filt) {
					if (!ttef_bounds_propagation(1, 2)) {
						// Inconsistency was detected
						return false;
					}
				} else {
#if CUMUVERB > 0
					fprintf(stderr, "Entering TTEF Consistency\n");
#endif
					if (!ttef_consistency_check(1)) {
						// Inconsistency was detected
						return false;
					}
#if CUMUVERB > 0
					fprintf(stderr, "Leaving TTEF Consistency\n");
#endif
				}
#if CUMUVERB > 0
				fprintf(stderr, "Leaving TTEF\n");
#endif
			}
		} while (idem && bound_update);
#if CUMUVERB > 0
		fprintf(stderr, "\tLeaving cumulative propagation loop\n");
		fprintf(stderr, "Leaving cumulative propagation without failure\n");
#endif
		return true;
	}